

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

int AF_A_Raise(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  DObject *this;
  DObject *this_00;
  player_t *this_01;
  int iVar1;
  DPSprite *this_02;
  undefined4 extraout_var;
  bool bVar2;
  bool local_66;
  bool local_63;
  DPSprite *psp;
  player_t *player;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x452,"int AF_A_Raise(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    this = (DObject *)(param->field_0).field_1.a;
    local_63 = true;
    if (this != (DObject *)0x0) {
      local_63 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    }
    if (local_63 != false) {
      if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
        bVar2 = false;
        if ((param[1].field_0.field_3.Type == '\x03') &&
           (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
          bVar2 = param[1].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar2) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                        ,0x452,"int AF_A_Raise(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        this_00 = (DObject *)param[1].field_0.field_1.a;
        local_66 = true;
        if (this_00 != (DObject *)0x0) {
          local_66 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
        }
        if (local_66 == false) {
          __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                        ,0x452,"int AF_A_Raise(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
        bVar2 = false;
        if ((param[2].field_0.field_3.Type == '\x03') &&
           (bVar2 = true, param[2].field_0.field_1.atag != 8)) {
          bVar2 = param[2].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar2) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                        ,0x452,"int AF_A_Raise(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      if ((this != (DObject *)0x0) &&
         (this_01 = *(player_t **)&this[0xc].ObjectFlags, this_01 != (player_t *)0x0)) {
        if (this_01->PendingWeapon == (AWeapon *)0xffffffffffffffff) {
          if (this_01->ReadyWeapon != (AWeapon *)0x0) {
            this_02 = player_t::GetPSprite(this_01,PSP_WEAPON);
            this_02->y = this_02->y - 6.0;
            if (this_02->y <= 32.375) {
              this_02->y = 32.375;
              iVar1 = (*(this_01->ReadyWeapon->super_AInventory).super_AActor.super_DThinker.
                        super_DObject._vptr_DObject[0x46])();
              DPSprite::SetState(this_02,(FState *)CONCAT44(extraout_var,iVar1),false);
            }
          }
        }
        else {
          P_DropWeapon(this_01);
        }
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x452,"int AF_A_Raise(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x452,"int AF_A_Raise(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AInventory, A_Raise)
{
	PARAM_ACTION_PROLOGUE;

	if (self == nullptr)
	{
		return 0;
	}
	player_t *player = self->player;
	DPSprite *psp;

	if (nullptr == player)
	{
		return 0;
	}
	if (player->PendingWeapon != WP_NOCHANGE)
	{
		P_DropWeapon(player);
		return 0;
	}
	if (player->ReadyWeapon == nullptr)
	{
		return 0;
	}
	psp = player->GetPSprite(PSP_WEAPON);
	psp->y -= RAISESPEED;
	if (psp->y > WEAPONTOP)
	{ // Not raised all the way yet
		return 0;
	}
	psp->y = WEAPONTOP;
	psp->SetState(player->ReadyWeapon->GetReadyState());
	return 0;
}